

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcmp16_s.c
# Opt level: O0

errno_t memcmp16_s(uint16_t *dest,rsize_t dmax,uint16_t *src,rsize_t smax,int *diff)

{
  long lVar1;
  ulong in_RCX;
  ushort *in_RDX;
  ulong in_RSI;
  ushort *in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  uint16_t *sp;
  uint16_t *dp;
  errno_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ushort *local_40;
  ulong local_30;
  ulong local_20;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8 == (int *)0x0) {
    invoke_safe_mem_constraint_handler
              ((char *)in_RDX,(void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    local_c = 400;
  }
  else {
    *in_R8 = -1;
    if (in_RDI == (ushort *)0x0) {
      invoke_safe_mem_constraint_handler
                ((char *)in_RDX,
                 (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      local_c = 400;
    }
    else if (in_RDX == (ushort *)0x0) {
      invoke_safe_mem_constraint_handler
                ((char *)0x0,(void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      local_c = 400;
    }
    else if (in_RSI == 0) {
      invoke_safe_mem_constraint_handler
                ((char *)in_RDX,
                 (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      local_c = 0x191;
    }
    else if (in_RSI < 0x8000001) {
      if (in_RCX == 0) {
        invoke_safe_mem_constraint_handler
                  ((char *)in_RDX,
                   (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        local_c = 0x191;
      }
      else if (in_RSI < in_RCX) {
        invoke_safe_mem_constraint_handler
                  ((char *)in_RDX,
                   (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        local_c = 0x193;
      }
      else if (in_RDI == in_RDX) {
        *in_R8 = 0;
        local_c = 0;
      }
      else {
        *in_R8 = 0;
        local_40 = in_RDI;
        local_30 = in_RCX;
        for (local_20 = in_RSI; local_20 != 0 && local_30 != 0; local_20 = local_20 - 1) {
          if (*local_40 != *in_RDX) {
            *in_R8 = (uint)*local_40 - (uint)*in_RDX;
            break;
          }
          local_30 = local_30 - 1;
          local_40 = local_40 + 1;
          in_RDX = in_RDX + 1;
        }
        local_c = 0;
      }
    }
    else {
      invoke_safe_mem_constraint_handler
                ((char *)in_RDX,
                 (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      local_c = 0x193;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memcmp16_s (const uint16_t *dest, rsize_t dmax,
            const uint16_t *src,  rsize_t smax, int *diff)
{

    const uint16_t *dp;
    const uint16_t *sp;

    dp = dest;
    sp = src;

    /*
     * must be able to return the diff
     */
    if (diff == NULL) {
        invoke_safe_mem_constraint_handler("memcmp16_s: diff is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }
    *diff = -1;  /* default diff */

    if (dp == NULL) {
        invoke_safe_mem_constraint_handler("memcmp16_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (sp == NULL) {
        invoke_safe_mem_constraint_handler("memcmp16_s: src is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (dmax == 0) {
        invoke_safe_mem_constraint_handler("memcmp16_s: dmax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (dmax > RSIZE_MAX_MEM16) {
        invoke_safe_mem_constraint_handler("memcmp16_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    if (smax == 0) {
        invoke_safe_mem_constraint_handler("memcmp16_s: smax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (smax > dmax) {
       invoke_safe_mem_constraint_handler("memcmp16_s: smax exceeds dmax",
                  NULL, ESLEMAX);
       return (RCNEGATE(ESLEMAX));
    }

    /*
     * no need to compare the same memory
     */
    if (dp == sp) {
        *diff = 0;
        return (RCNEGATE(EOK));
    }

    /*
     * now compare sp to dp
     */
    *diff = 0;
    while (dmax != 0 && smax != 0) {
        if (*dp != *sp) {
            *diff = *dp - *sp;
            break;
        }

        dmax--;
        smax--;

        dp++;
        sp++;
    }

    return (RCNEGATE(EOK));
}